

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

double __thiscall
helics::RandomDelayFilterOperation::getProperty
          (RandomDelayFilterOperation *this,string_view property)

{
  int iVar1;
  char *__s1;
  size_t __n;
  long lVar2;
  size_type __rlen;
  double dVar3;
  
  __s1 = property._M_str;
  __n = property._M_len;
  dVar3 = -1e+49;
  lVar2 = __n - 3;
  switch(lVar2) {
  case 0:
switchD_00262d6d_caseD_0:
    iVar1 = bcmp(__s1,"min",__n);
    if (iVar1 != 0) {
      switch(lVar2) {
      case 0:
        goto switchD_00262da1_caseD_0;
      case 1:
        goto switchD_00262e09_caseD_1;
      case 2:
        goto switchD_00262d6d_caseD_2;
      case 3:
        goto switchD_00262dd5_caseD_3;
      default:
        goto switchD_00262d6d_default;
      }
    }
    goto LAB_00262ecd;
  case 1:
switchD_00262d6d_caseD_1:
    iVar1 = bcmp(__s1,"mean",__n);
    if (iVar1 != 0) {
      switch(lVar2) {
      case 0:
        goto switchD_00262d6d_caseD_0;
      case 1:
        goto switchD_00262e09_caseD_1;
      case 2:
        goto switchD_00262d6d_caseD_2;
      case 3:
        goto switchD_00262dd5_caseD_3;
      default:
        goto switchD_00262d6d_default;
      }
    }
    goto LAB_00262ecd;
  case 2:
    break;
  case 3:
    iVar1 = bcmp(__s1,"param1",__n);
    if (iVar1 != 0) {
      switch(lVar2) {
      case 0:
        goto switchD_00262d6d_caseD_0;
      case 1:
        goto switchD_00262d6d_caseD_1;
      case 2:
        goto switchD_00262d6d_caseD_2;
      case 3:
        goto switchD_00262dd5_caseD_3;
      default:
        goto switchD_00262d6d_default;
      }
    }
    goto LAB_00262ecd;
  default:
    goto switchD_00262d6d_default;
  }
switchD_00262d6d_caseD_2:
  iVar1 = bcmp(__s1,"alpha",__n);
  if (iVar1 == 0) {
LAB_00262ecd:
    lVar2 = 8;
  }
  else if (__n == 3) {
switchD_00262da1_caseD_0:
    iVar1 = bcmp(__s1,"max",__n);
    if (iVar1 != 0) {
      if (__n != 4) {
switchD_00262d6d_default:
        return -1e+49;
      }
switchD_00262e09_caseD_1:
      iVar1 = bcmp(__s1,"beta",__n);
      if (iVar1 != 0) {
        return -1e+49;
      }
    }
    lVar2 = 0x10;
  }
  else {
    if (__n == 4) goto switchD_00262e09_caseD_1;
    if (__n != 6) {
      return -1e+49;
    }
switchD_00262dd5_caseD_3:
    iVar1 = bcmp(__s1,"param2",__n);
    lVar2 = 0x10;
    if (iVar1 != 0) {
      if (__n == 3) goto switchD_00262da1_caseD_0;
      if (__n == 4) goto switchD_00262e09_caseD_1;
      if (__n != 6) {
        return -1e+49;
      }
      iVar1 = bcmp(__s1,"stddev",6);
      if (iVar1 != 0) {
        return -1e+49;
      }
    }
  }
  dVar3 = *(double *)
           ((long)&(((this->rdelayGen)._M_t.
                     super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                     .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                   dist)._M_i + lVar2);
switchD_00262d6d_default:
  return dVar3;
}

Assistant:

double RandomDelayFilterOperation::getProperty(std::string_view property)
{
    if ((property == "param1") || (property == "mean") || (property == "min") ||
        (property == "alpha")) {
        return (rdelayGen->param1.load());
    }
    if ((property == "param2") || (property == "stddev") || (property == "max") ||
        (property == "beta")) {
        return (rdelayGen->param2.load());
    }
    return FilterOperations::getProperty(property);
}